

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O1

char * __thiscall util::fs::dirname(fs *this,char *__path)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  
  lVar2 = *(long *)(__path + 8);
  if (lVar2 == 0) {
LAB_0010bd7b:
    *(fs **)this = this + 0x10;
    pcVar6 = ".";
    pcVar5 = "";
LAB_0010bda7:
    std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar6,pcVar5);
  }
  else {
    lVar7 = 0;
    lVar8 = *(long *)__path;
    do {
      lVar8 = lVar8 + -1;
      if (lVar2 == lVar7) {
        *(fs **)this = this + 0x10;
        pcVar6 = "/";
        pcVar5 = "";
        goto LAB_0010bda7;
      }
      lVar7 = lVar7 + 1;
    } while (*(char *)(lVar8 + lVar2) == '/');
    uVar3 = (lVar2 - lVar7) + 3;
    pcVar5 = (char *)((*(long *)__path + lVar2 + 1) - lVar7);
    do {
      if (uVar3 == 2) goto LAB_0010bd7b;
      pcVar4 = pcVar5 + -1;
      uVar3 = uVar3 - 1;
      pcVar6 = pcVar5 + -1;
      pcVar5 = pcVar4;
    } while (*pcVar6 != '/');
    do {
      uVar3 = uVar3 - 1;
      if (uVar3 < 2) break;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + -1;
    } while (cVar1 == '/');
    std::__cxx11::string::substr((ulong)this,(ulong)__path);
  }
  return (char *)this;
}

Assistant:

std::string
dirname (std::string const& path)
{
    if (path.empty())
        return ".";

    /* Skip group of slashes at the end. */
    std::size_t len = path.size();
    while (len > 0 && path[len - 1] == '/')
        len -= 1;
    if (len == 0)
        return "/";

    /* Skip basename. */
    while (len > 0 && path[len - 1] != '/')
        len -= 1;
    if (len == 0)
        return ".";

    /* Skip group of slashes. */
    while (len > 1 && path[len - 1] == '/')
        len -= 1;

    return path.substr(0, len);
}